

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O2

void __thiscall cmLBDepend::DependWalk(cmLBDepend *this,cmDependInformation *info)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  long lVar4;
  pointer pbVar5;
  char cVar6;
  string cxxFile;
  string path;
  string currentline;
  string line;
  string root;
  string includeFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream fin;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&fin,(info->FullPath)._M_dataplus._M_p,_S_in);
  if ((abStack_218[*(long *)(_fin + -0x18)] & 5) == 0) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
LAB_0037be10:
    do {
      bVar1 = cmsys::SystemTools::GetLineFromStream((istream *)&fin,&line,(bool *)0x0,-1);
      if (!bVar1) goto LAB_0037c35c;
      currentline._M_dataplus = line._M_dataplus;
      bVar1 = cmHasLiteralPrefix<char_const*,9ul>((char **)&currentline,(char (*) [9])"#include");
      if (bVar1) {
        std::__cxx11::string::string((string *)&currentline,(string *)&line);
        cVar6 = (char)&currentline;
        lVar4 = std::__cxx11::string::find(cVar6,0x22);
        if (lVar4 == -1) {
          lVar4 = std::__cxx11::string::find(cVar6,0x3c);
          if (lVar4 == -1) {
            cmSystemTools::Error
                      ("unknown include directive ",currentline._M_dataplus._M_p,(char *)0x0,
                       (char *)0x0);
            std::__cxx11::string::~string((string *)&currentline);
            goto LAB_0037be10;
          }
          bVar2 = 0x3e;
        }
        else {
          bVar2 = 0x22;
        }
        std::__cxx11::string::find((char)&currentline,(ulong)bVar2);
        std::__cxx11::string::substr((ulong)&includeFile,(ulong)&currentline);
        bVar1 = cmsys::RegularExpression::find
                          (&this->IncludeFileRegularExpression,includeFile._M_dataplus._M_p);
        if (bVar1) {
          AddDependency(this,info,includeFile._M_dataplus._M_p);
          std::__cxx11::string::string((string *)&cxxFile,(string *)&includeFile);
          lVar4 = std::__cxx11::string::rfind((char)&cxxFile,0x2e);
          if (lVar4 != -1) {
            std::__cxx11::string::substr((ulong)&root,(ulong)&cxxFile);
            std::operator+(&path,&root,".cxx");
            std::__cxx11::string::operator=((string *)&cxxFile,(string *)&path);
            std::__cxx11::string::~string((string *)&path);
            bVar1 = cmsys::SystemTools::FileExists(cxxFile._M_dataplus._M_p);
            for (pbVar5 = (this->IncludeDirectories).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pbVar5 != (this->IncludeDirectories).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
              std::__cxx11::string::string((string *)&path,(string *)pbVar5);
              std::operator+(&local_258,&path,"/");
              std::__cxx11::string::operator=((string *)&path,(string *)&local_258);
              std::__cxx11::string::~string((string *)&local_258);
              std::operator+(&local_258,&path,&cxxFile);
              std::__cxx11::string::operator=((string *)&path,(string *)&local_258);
              std::__cxx11::string::~string((string *)&local_258);
              bVar3 = cmsys::SystemTools::FileExists(path._M_dataplus._M_p);
              if (bVar3) {
                bVar1 = true;
              }
              std::__cxx11::string::~string((string *)&path);
            }
            if (bVar1 == false) {
              std::operator+(&path,&root,".cpp");
              std::__cxx11::string::operator=((string *)&cxxFile,(string *)&path);
              std::__cxx11::string::~string((string *)&path);
              bVar3 = cmsys::SystemTools::FileExists(cxxFile._M_dataplus._M_p);
              if (bVar3) {
                bVar1 = true;
              }
              for (pbVar5 = (this->IncludeDirectories).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pbVar5 != (this->IncludeDirectories).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
                std::__cxx11::string::string((string *)&path,(string *)pbVar5);
                std::operator+(&local_258,&path,"/");
                std::__cxx11::string::operator=((string *)&path,(string *)&local_258);
                std::__cxx11::string::~string((string *)&local_258);
                std::operator+(&local_258,&path,&cxxFile);
                std::__cxx11::string::operator=((string *)&path,(string *)&local_258);
                std::__cxx11::string::~string((string *)&local_258);
                bVar3 = cmsys::SystemTools::FileExists(path._M_dataplus._M_p);
                if (bVar3) {
                  bVar1 = true;
                }
                std::__cxx11::string::~string((string *)&path);
              }
            }
            if (bVar1 == false) {
              std::operator+(&path,&root,".c");
              std::__cxx11::string::operator=((string *)&cxxFile,(string *)&path);
              std::__cxx11::string::~string((string *)&path);
              bVar3 = cmsys::SystemTools::FileExists(cxxFile._M_dataplus._M_p);
              if (bVar3) {
                bVar1 = true;
              }
              for (pbVar5 = (this->IncludeDirectories).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pbVar5 != (this->IncludeDirectories).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
                std::__cxx11::string::string((string *)&path,(string *)pbVar5);
                std::operator+(&local_258,&path,"/");
                std::__cxx11::string::operator=((string *)&path,(string *)&local_258);
                std::__cxx11::string::~string((string *)&local_258);
                std::operator+(&local_258,&path,&cxxFile);
                std::__cxx11::string::operator=((string *)&path,(string *)&local_258);
                std::__cxx11::string::~string((string *)&local_258);
                bVar3 = cmsys::SystemTools::FileExists(path._M_dataplus._M_p);
                if (bVar3) {
                  bVar1 = true;
                }
                std::__cxx11::string::~string((string *)&path);
              }
            }
            if (bVar1 == false) {
              std::operator+(&path,&root,".txx");
              std::__cxx11::string::operator=((string *)&cxxFile,(string *)&path);
              std::__cxx11::string::~string((string *)&path);
              bVar3 = cmsys::SystemTools::FileExists(cxxFile._M_dataplus._M_p);
              if (bVar3) {
                bVar1 = true;
              }
              for (pbVar5 = (this->IncludeDirectories).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pbVar5 != (this->IncludeDirectories).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
                std::__cxx11::string::string((string *)&path,(string *)pbVar5);
                std::operator+(&local_258,&path,"/");
                std::__cxx11::string::operator=((string *)&path,(string *)&local_258);
                std::__cxx11::string::~string((string *)&local_258);
                std::operator+(&local_258,&path,&cxxFile);
                std::__cxx11::string::operator=((string *)&path,(string *)&local_258);
                std::__cxx11::string::~string((string *)&local_258);
                bVar3 = cmsys::SystemTools::FileExists(path._M_dataplus._M_p);
                if (bVar3) {
                  bVar1 = true;
                }
                std::__cxx11::string::~string((string *)&path);
              }
            }
            if (bVar1 != false) {
              AddDependency(this,info,cxxFile._M_dataplus._M_p);
            }
            std::__cxx11::string::~string((string *)&root);
          }
LAB_0037c0b3:
          std::__cxx11::string::~string((string *)&cxxFile);
        }
        else if (this->Verbose == true) {
          std::__cxx11::string::string((string *)&cxxFile,"Skipping ",(allocator *)&root);
          std::__cxx11::string::append((string *)&cxxFile);
          std::__cxx11::string::append((char *)&cxxFile);
          std::__cxx11::string::append((char *)&cxxFile);
          cmSystemTools::Error(cxxFile._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
          goto LAB_0037c0b3;
        }
        std::__cxx11::string::~string((string *)&includeFile);
        std::__cxx11::string::~string((string *)&currentline);
      }
    } while( true );
  }
  cmSystemTools::Error
            ("error can not open ",(info->FullPath)._M_dataplus._M_p,(char *)0x0,(char *)0x0);
LAB_0037c366:
  std::ifstream::~ifstream(&fin);
  return;
LAB_0037c35c:
  std::__cxx11::string::~string((string *)&line);
  goto LAB_0037c366;
}

Assistant:

void DependWalk(cmDependInformation* info)
  {
    cmsys::ifstream fin(info->FullPath.c_str());
    if(!fin)
      {
      cmSystemTools::Error("error can not open ", info->FullPath.c_str());
      return;
      }

    std::string line;
    while(cmSystemTools::GetLineFromStream(fin, line))
      {
      if(cmHasLiteralPrefix(line.c_str(), "#include"))
        {
        // if it is an include line then create a string class
        std::string currentline = line;
        size_t qstart = currentline.find('\"', 8);
        size_t qend;
        // if a quote is not found look for a <
        if(qstart == std::string::npos)
          {
          qstart = currentline.find('<', 8);
          // if a < is not found then move on
          if(qstart == std::string::npos)
            {
            cmSystemTools::Error("unknown include directive ",
                                 currentline.c_str() );
            continue;
            }
          else
            {
            qend = currentline.find('>', qstart+1);
            }
          }
        else
          {
          qend = currentline.find('\"', qstart+1);
          }
        // extract the file being included
        std::string includeFile =
          currentline.substr(qstart+1, qend - qstart-1);
        // see if the include matches the regular expression
        if(!this->IncludeFileRegularExpression.find(includeFile))
          {
          if(this->Verbose)
            {
            std::string message = "Skipping ";
            message += includeFile;
            message += " for file ";
            message += info->FullPath.c_str();
            cmSystemTools::Error(message.c_str(), 0);
            }
          continue;
          }

        // Add this file and all its dependencies.
        this->AddDependency(info, includeFile.c_str());
        /// add the cxx file if it exists
        std::string cxxFile = includeFile;
        std::string::size_type pos = cxxFile.rfind('.');
        if(pos != std::string::npos)
          {
          std::string root = cxxFile.substr(0, pos);
          cxxFile = root + ".cxx";
          bool found = false;
          // try jumping to .cxx .cpp and .c in order
          if(cmSystemTools::FileExists(cxxFile.c_str()))
            {
            found = true;
            }
          for(std::vector<std::string>::iterator i =
              this->IncludeDirectories.begin();
              i != this->IncludeDirectories.end(); ++i)
            {
            std::string path = *i;
            path = path + "/";
            path = path + cxxFile;
            if(cmSystemTools::FileExists(path.c_str()))
              {
              found = true;
              }
            }
          if (!found)
            {
            cxxFile = root + ".cpp";
            if(cmSystemTools::FileExists(cxxFile.c_str()))
              {
              found = true;
              }
            for(std::vector<std::string>::iterator i =
                this->IncludeDirectories.begin();
                i != this->IncludeDirectories.end(); ++i)
              {
              std::string path = *i;
              path = path + "/";
              path = path + cxxFile;
              if(cmSystemTools::FileExists(path.c_str()))
                {
                found = true;
                }
              }
            }
          if (!found)
            {
            cxxFile = root + ".c";
            if(cmSystemTools::FileExists(cxxFile.c_str()))
              {
              found = true;
              }
            for(std::vector<std::string>::iterator i =
                this->IncludeDirectories.begin();
                i != this->IncludeDirectories.end(); ++i)
              {
              std::string path = *i;
              path = path + "/";
              path = path + cxxFile;
              if(cmSystemTools::FileExists(path.c_str()))
                {
                found = true;
                }
              }
            }
          if (!found)
            {
            cxxFile = root + ".txx";
            if(cmSystemTools::FileExists(cxxFile.c_str()))
              {
              found = true;
              }
            for(std::vector<std::string>::iterator i =
                this->IncludeDirectories.begin();
                i != this->IncludeDirectories.end(); ++i)
              {
              std::string path = *i;
              path = path + "/";
              path = path + cxxFile;
              if(cmSystemTools::FileExists(path.c_str()))
                {
                found = true;
                }
              }
            }
          if (found)
            {
            this->AddDependency(info, cxxFile.c_str());
            }
          }
        }
      }
  }